

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteCustomCommandBuildStatements(cmLocalNinjaGenerator *this)

{
  pointer *ppbVar1;
  bool bVar2;
  reference ppcVar3;
  pointer ppVar4;
  cmGlobalNinjaGenerator *pcVar5;
  reference ppcVar6;
  iterator iVar7;
  iterator iVar8;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsIntersection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jDeps;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccTargetDeps;
  _Self local_48;
  iterator j;
  _Self local_38;
  iterator i;
  cmCustomCommand *customCommand;
  iterator __end1;
  iterator __begin1;
  vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *__range1;
  cmLocalNinjaGenerator *this_local;
  
  __end1 = std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::begin
                     (&this->CustomCommands);
  customCommand =
       (cmCustomCommand *)
       std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::end
                 (&this->CustomCommands);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmCustomCommand_**,_std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>_>
                                *)&customCommand);
    if (!bVar2) {
      return;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_cmCustomCommand_**,_std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>_>
              ::operator*(&__end1);
    i._M_node = (_Base_ptr)*ppcVar3;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_cmCustomCommand_*,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>_>
         ::find(&this->CustomCommandTargets,(key_type *)&i);
    j._M_node = (_Base_ptr)
                std::
                map<const_cmCustomCommand_*,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>_>
                ::end(&this->CustomCommandTargets);
    bVar2 = std::operator!=(&local_38,(_Self *)&j);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>
             ::operator->(&local_38);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
         ::begin(&ppVar4->second);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>
             ::operator->(&local_38);
    ccTargetDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                  ::end(&ppVar4->second);
    bVar2 = std::operator!=(&local_48,
                            (_Self *)&ccTargetDeps.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) {
      __assert_fail("j != i->second.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalNinjaGenerator.cxx"
                    ,0x223,"void cmLocalNinjaGenerator::WriteCustomCommandBuildStatements()");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    pcVar5 = GetGlobalNinjaGenerator(this);
    ppcVar6 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&local_48);
    cmGlobalNinjaGenerator::AppendTargetDependsClosure(pcVar5,*ppcVar6,(cmNinjaDeps *)local_68);
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    iVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar7._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar8._M_current);
    std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&local_48);
    while( true ) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>
               ::operator->(&local_38);
      jDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                    ::end(&ppVar4->second);
      bVar2 = std::operator!=(&local_48,
                              (_Self *)&jDeps.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&depsIntersection.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c0);
      pcVar5 = GetGlobalNinjaGenerator(this);
      ppcVar6 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&local_48);
      cmGlobalNinjaGenerator::AppendTargetDependsClosure
                (pcVar5,*ppcVar6,
                 (cmNinjaDeps *)
                 &depsIntersection.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppbVar1 = &depsIntersection.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppbVar1);
      iVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)ppbVar1);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar7._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar8._M_current);
      iVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
      iVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
      ppbVar1 = &depsIntersection.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __first2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)ppbVar1);
      __last2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppbVar1);
      __result = std::
                 back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_c0);
      std::
      set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar7._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar8._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first2._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last2._M_current,__result);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&depsIntersection.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&local_48);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>
             ::operator->(&local_38);
    WriteCustomCommandBuildStatement(this,ppVar4->first,(cmNinjaDeps *)local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_**,_std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("i != this->CustomCommandTargets.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalNinjaGenerator.cxx"
                ,0x217,"void cmLocalNinjaGenerator::WriteCustomCommandBuildStatements()");
}

Assistant:

void cmLocalNinjaGenerator::WriteCustomCommandBuildStatements()
{
  for (cmCustomCommand const* customCommand : this->CustomCommands) {
    CustomCommandTargetMap::iterator i =
      this->CustomCommandTargets.find(customCommand);
    assert(i != this->CustomCommandTargets.end());

    // A custom command may appear on multiple targets.  However, some build
    // systems exist where the target dependencies on some of the targets are
    // overspecified, leading to a dependency cycle.  If we assume all target
    // dependencies are a superset of the true target dependencies for this
    // custom command, we can take the set intersection of all target
    // dependencies to obtain a correct dependency list.
    //
    // FIXME: This won't work in certain obscure scenarios involving indirect
    // dependencies.
    std::set<cmGeneratorTarget*>::iterator j = i->second.begin();
    assert(j != i->second.end());
    std::vector<std::string> ccTargetDeps;
    this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(*j,
                                                                ccTargetDeps);
    std::sort(ccTargetDeps.begin(), ccTargetDeps.end());
    ++j;

    for (; j != i->second.end(); ++j) {
      std::vector<std::string> jDeps, depsIntersection;
      this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(*j, jDeps);
      std::sort(jDeps.begin(), jDeps.end());
      std::set_intersection(ccTargetDeps.begin(), ccTargetDeps.end(),
                            jDeps.begin(), jDeps.end(),
                            std::back_inserter(depsIntersection));
      ccTargetDeps = depsIntersection;
    }

    this->WriteCustomCommandBuildStatement(i->first, ccTargetDeps);
  }
}